

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# archive_read_support_format_cpio.c
# Opt level: O0

int archive_read_format_cpio_skip(archive_read *a)

{
  void *pvVar1;
  long request;
  int64_t iVar2;
  int64_t to_skip;
  cpio *cpio;
  archive_read *a_local;
  
  pvVar1 = a->format->data;
  request = *(long *)((long)pvVar1 + 0x18) + *(long *)((long)pvVar1 + 0x30) +
            *(long *)((long)pvVar1 + 0x20);
  iVar2 = __archive_read_consume(a,request);
  if (request == iVar2) {
    *(undefined8 *)((long)pvVar1 + 0x18) = 0;
    *(undefined8 *)((long)pvVar1 + 0x30) = 0;
    *(undefined8 *)((long)pvVar1 + 0x20) = 0;
    a_local._4_4_ = 0;
  }
  else {
    a_local._4_4_ = -0x1e;
  }
  return a_local._4_4_;
}

Assistant:

static int
archive_read_format_cpio_skip(struct archive_read *a)
{
	struct cpio *cpio = (struct cpio *)(a->format->data);
	int64_t to_skip = cpio->entry_bytes_remaining + cpio->entry_padding +
		cpio->entry_bytes_unconsumed;

	if (to_skip != __archive_read_consume(a, to_skip)) {
		return (ARCHIVE_FATAL);
	}
	cpio->entry_bytes_remaining = 0;
	cpio->entry_padding = 0;
	cpio->entry_bytes_unconsumed = 0;
	return (ARCHIVE_OK);
}